

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void file_compress(char *file,char *mode)

{
  size_t sVar1;
  FILE *in;
  gzFile out;
  char outfile [1024];
  
  sVar1 = strlen(file);
  if (sVar1 - 0x3fd < 0xfffffffffffffc00) {
    fprintf(_stderr,"%s: filename too long\n",prog);
  }
  else {
    snprintf(outfile,0x400,"%s%s",file,".gz");
    in = fopen(file,"rb");
    if (in == (FILE *)0x0) {
      perror(file);
    }
    else {
      out = (gzFile)gzopen(outfile,mode);
      if (out != (gzFile)0x0) {
        gz_compress((FILE *)in,out);
        unlink(file);
        return;
      }
      fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,outfile);
    }
  }
  exit(1);
}

Assistant:

void file_compress(file, mode)
    char  *file;
    char  *mode;
{
    local char outfile[MAX_NAME_LEN];
    FILE  *in;
    gzFile out;

    if (strlen(file) + strlen(GZ_SUFFIX) >= sizeof(outfile)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outfile, sizeof(outfile), "%s%s", file, GZ_SUFFIX);
#else
    strcpy(outfile, file);
    strcat(outfile, GZ_SUFFIX);
#endif

    in = fopen(file, "rb");
    if (in == NULL) {
        perror(file);
        exit(1);
    }
    out = gzopen(outfile, mode);
    if (out == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, outfile);
        exit(1);
    }
    gz_compress(in, out);

    unlink(file);
}